

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isMatchingDelims(TokenKind openKind,TokenKind closeKind)

{
  TokenKind TVar1;
  
  TVar1 = getSkipToKind(openKind);
  return TVar1 == closeKind || (ushort)(closeKind - JoinKeyword) < 3 && openKind == ForkKeyword;
}

Assistant:

bool SyntaxFacts::isMatchingDelims(TokenKind openKind, TokenKind closeKind) {
    if (getSkipToKind(openKind) == closeKind)
        return true;

    if (openKind == TokenKind::ForkKeyword) {
        switch (closeKind) {
            case TokenKind::JoinKeyword:
            case TokenKind::JoinAnyKeyword:
            case TokenKind::JoinNoneKeyword:
                return true;
            default:
                break;
        }
    }

    return false;
}